

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O3

coop_repository_stats_t * __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
query_coop_repository_stats
          (coop_repository_stats_t *__return_storage_ptr__,
          env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
          *this)

{
  _Map_pointer pppcVar1;
  coop_repository_stats_t stats;
  coop_repository_stats_t local_38;
  
  so_5::impl::coop_repository_basis_t::query_stats
            (&local_38,&(this->m_coop_repo).super_coop_repository_basis_t);
  __return_storage_ptr__->m_registered_coop_count = local_38.m_registered_coop_count;
  __return_storage_ptr__->m_deregistered_coop_count = local_38.m_deregistered_coop_count;
  __return_storage_ptr__->m_total_agent_count = local_38.m_total_agent_count;
  pppcVar1 = (this->m_final_dereg_coops).
             super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  __return_storage_ptr__->m_final_dereg_coop_count =
       ((long)(this->m_final_dereg_coops).
              super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_last -
        (long)(this->m_final_dereg_coops).
              super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur >> 3) +
       ((long)(this->m_final_dereg_coops).
              super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur -
        (long)(this->m_final_dereg_coops).
              super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first >> 3) +
       ((((ulong)((long)pppcVar1 -
                 (long)(this->m_final_dereg_coops).
                       super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>._M_impl.
                       super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
       (ulong)(pppcVar1 == (_Map_pointer)0x0)) * 0x40;
  return __return_storage_ptr__;
}

Assistant:

so_5::environment_infrastructure_t::coop_repository_stats_t
env_infrastructure_t< ACTIVITY_TRACKER >::query_coop_repository_stats()
	{
		const auto stats = m_coop_repo.query_stats();

		return environment_infrastructure_t::coop_repository_stats_t{
				stats.m_registered_coop_count,
				stats.m_deregistered_coop_count,
				stats.m_total_agent_count,
				m_final_dereg_coops.size()
		};
	}